

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFtpTransfer.cpp
# Opt level: O0

void __thiscall
CFtpTransfer::CFtpTransfer(CFtpTransfer *this,string *ip,int port,int max_connection)

{
  bool bVar1;
  ostream *this_00;
  string local_40;
  int local_20;
  int local_1c;
  int max_connection_local;
  int port_local;
  string *ip_local;
  CFtpTransfer *this_local;
  
  local_20 = max_connection;
  local_1c = port;
  _max_connection_local = ip;
  ip_local = (string *)this;
  std::__cxx11::string::string((string *)&local_40,(string *)ip);
  CTransfer::CTransfer(&this->super_CTransfer,&local_40,local_1c);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_CTransfer)._vptr_CTransfer = (_func_int **)&PTR_Accept_0014f548;
  CManageClient::CManageClient(&this->m_ClientManager);
  this->m_MaxConnections = local_20;
  this->m_CurrentConnetions = 0;
  bVar1 = CManageClient::LoadConfig(&this->m_ClientManager);
  if (!bVar1) {
    this_00 = std::operator<<((ostream *)&std::cout,
                              "Can not find the deny_ip config file,program would exit");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    exit(-1);
  }
  return;
}

Assistant:

CFtpTransfer::CFtpTransfer(const string ip,const int port,const int max_connection)
        :CTransfer(ip,port),m_CurrentConnetions(0),m_MaxConnections(max_connection){
    if(!m_ClientManager.LoadConfig()){
        cout << "Can not find the deny_ip config file,program would exit" << endl;
        exit(-1);
    }
}